

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_Symbol_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  ulong uVar7;
  bool bVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue JVar12;
  int64_t iStackY_80;
  int64_t local_48;
  int64_t thisIndex;
  
  if ((int)this_val.tag == -1) {
    JVar9 = JS_ToString(ctx,*argv);
    iStackY_80 = 3;
    if ((int)JVar9.tag == 6) {
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      uVar4 = 0;
      uVar7 = 0;
      goto LAB_00136da1;
    }
    JVar10 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
    iVar1 = JS_ToBoolFree(ctx,JVar10);
    if (iVar1 < 0) {
LAB_00136d93:
      iStackY_80 = 3;
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      uVar4 = 0;
      uVar7 = 0;
    }
    else {
      if (iVar1 == 0) {
        JVar11 = JS_RegExpExec(ctx,this_val,JVar9);
        uVar7 = (ulong)JVar11.u.ptr >> 0x20;
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00136e1c:
        iVar6 = JVar11.tag;
        JS_FreeValue(ctx,JVar10);
        JS_FreeValue(ctx,JVar9);
        uVar7 = uVar7 << 0x20;
        uVar3 = (ulong)JVar11.u.ptr & 0xffffffff;
        goto LAB_00136ddc;
      }
      JVar10 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
      iVar1 = JS_ToBoolFree(ctx,JVar10);
      if (iVar1 < 0) goto LAB_00136d93;
      iVar2 = JS_SetProperty(ctx,this_val,0x55,(JSValue)ZEXT816(0));
      if (iVar2 < 0) {
        iStackY_80 = 3;
        uVar4 = 0;
        uVar7 = 0;
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        JVar11 = JS_NewArray(ctx);
        iStackY_80 = JVar11.tag;
        uVar7 = (ulong)JVar11.u.ptr >> 0x20;
        uVar4 = JVar11.u._0_4_;
        if ((int)JVar11.tag != 6) {
          local_48 = 0;
          JVar10 = (JSValue)(ZEXT816(3) << 0x40);
          while( true ) {
            JS_FreeValue(ctx,JVar10);
            JVar10 = JS_RegExpExec(ctx,this_val,JVar9);
            if ((int)JVar10.tag == 2) break;
            if ((int)JVar10.tag == 6) goto LAB_00136da1;
            JVar12 = JS_GetPropertyInt64(ctx,JVar10,0);
            JVar12 = JS_ToStringFree(ctx,JVar12);
            if ((int)JVar12.tag == -7) {
              bVar8 = (*(uint *)((long)JVar12.u.ptr + 4) & 0x7fffffff) != 0;
            }
            else {
              bVar8 = true;
              if ((int)JVar12.tag == 6) goto LAB_00136da1;
            }
            iVar2 = JS_SetPropertyInt64(ctx,JVar11,local_48,JVar12);
            if (iVar2 < 0) goto LAB_00136da1;
            if (!bVar8) {
              JVar12 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
              iVar2 = JS_ToLengthFree(ctx,&thisIndex,JVar12);
              if (iVar2 < 0) goto LAB_00136da1;
              uVar3 = string_advance_index((JSString *)JVar9.u.ptr,thisIndex,iVar1);
              bVar8 = (long)(int)uVar3 == uVar3;
              JVar5.float64 = (double)(long)uVar3;
              if (bVar8) {
                JVar5.ptr = (void *)(uVar3 & 0xffffffff);
              }
              iVar6 = 7;
              if (bVar8) {
                iVar6 = 0;
              }
              JVar12.tag = iVar6;
              JVar12.u.float64 = JVar5.float64;
              iVar2 = JS_SetProperty(ctx,this_val,0x55,JVar12);
              if (iVar2 < 0) goto LAB_00136da1;
            }
            local_48 = local_48 + 1;
          }
          if (local_48 == 0) {
            JS_FreeValue(ctx,JVar11);
            JVar11 = (JSValue)(ZEXT816(2) << 0x40);
            uVar7 = 0;
          }
          goto LAB_00136e1c;
        }
        JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      }
    }
LAB_00136da1:
    JVar11.u.ptr = (void *)((ulong)uVar4 | uVar7 << 0x20);
    JVar11.tag = iStackY_80;
    JS_FreeValue(ctx,JVar11);
    JS_FreeValue(ctx,JVar10);
    JS_FreeValue(ctx,JVar9);
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar6 = 6;
  uVar3 = 0;
  uVar7 = 0;
LAB_00136ddc:
  JVar9.u.ptr = (void *)(uVar3 | uVar7);
  JVar9.tag = iVar6;
  return JVar9;
}

Assistant:

static JSValue js_regexp_Symbol_match(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    // [Symbol.match](str)
    JSValueConst rx = this_val;
    JSValue A, S, result, matchStr;
    int global, n, fullUnicode, isEmpty;
    JSString *p;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    A = JS_UNDEFINED;
    result = JS_UNDEFINED;
    matchStr = JS_UNDEFINED;
    S = JS_ToString(ctx, argv[0]);
    if (JS_IsException(S))
        goto exception;

    global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (global < 0)
        goto exception;

    if (!global) {
        A = JS_RegExpExec(ctx, rx, S);
    } else {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;

        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
        A = JS_NewArray(ctx);
        if (JS_IsException(A))
            goto exception;
        n = 0;
        for(;;) {
            JS_FreeValue(ctx, result);
            result = JS_RegExpExec(ctx, rx, S);
            if (JS_IsException(result))
                goto exception;
            if (JS_IsNull(result))
                break;
            matchStr = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
            if (JS_IsException(matchStr))
                goto exception;
            isEmpty = JS_IsEmptyString(matchStr);
            if (JS_SetPropertyInt64(ctx, A, n++, matchStr) < 0)
                goto exception;
            if (isEmpty) {
                int64_t thisIndex, nextIndex;
                if (JS_ToLengthFree(ctx, &thisIndex,
                                    JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                    goto exception;
                p = JS_VALUE_GET_STRING(S);
                nextIndex = string_advance_index(p, thisIndex, fullUnicode);
                if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                    goto exception;
            }
        }
        if (n == 0) {
            JS_FreeValue(ctx, A);
            A = JS_NULL;
        }
    }
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return JS_EXCEPTION;
}